

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O3

void pacf_burg(double *vec,int N,double *par,int M)

{
  ulong uVar1;
  double *phi;
  ulong uVar2;
  double local_48;
  double var;
  double *local_38;
  
  var = (double)par;
  local_38 = vec;
  phi = (double *)malloc((long)M * 8);
  if (0 < M) {
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      burgalg(local_38,N + -1,(int)uVar1,phi,&local_48);
      *(double *)((long)var + uVar2 * 8) = phi[uVar2];
      uVar2 = uVar1;
    } while ((uint)M != uVar1);
  }
  free(phi);
  return;
}

Assistant:

void pacf_burg(double* vec, int N, double* par, int M) {
	int i;
	double *temp;
	double var;

	temp = (double*)malloc(sizeof(double)* M);
	for (i = 0; i < M; ++i) {
		burgalg(vec, N-1, i + 1, temp, &var);
		par[i] = temp[i];
	}
	free(temp);
}